

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O0

int coda_cursor_goto_attributes(coda_cursor *cursor)

{
  coda_backend cVar1;
  int iVar2;
  coda_cursor *cursor_local;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (cursor->stack[cursor->n + -1].type == (coda_dynamic_type_struct *)0x0)) {
    coda_set_error(-100,"invalid cursor argument (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                   ,0x4d7);
    cursor_local._4_4_ = -1;
  }
  else if (cursor->n == 0x20) {
    coda_set_error(-100,"maximum depth in cursor (%d) reached (%s:%u)",(ulong)(uint)cursor->n,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                   ,0x4de);
    cursor_local._4_4_ = -1;
  }
  else {
    cVar1 = (cursor->stack[cursor->n + -1].type)->backend;
    if (cVar1 < 2) {
      iVar2 = coda_ascbin_cursor_goto_attributes(cursor);
      if (iVar2 != 0) {
        return -1;
      }
    }
    else if (cVar1 == coda_backend_memory) {
      iVar2 = coda_mem_cursor_goto_attributes(cursor);
      if (iVar2 != 0) {
        return -1;
      }
    }
    else {
      if (cVar1 == coda_backend_hdf4) {
        coda_set_error(-0xb,(char *)0x0);
        return -1;
      }
      if (cVar1 == coda_backend_hdf5) {
        coda_set_error(-0xd,(char *)0x0);
        return -1;
      }
      if (cVar1 == coda_backend_cdf) {
        iVar2 = coda_cdf_cursor_goto_attributes(cursor);
        if (iVar2 != 0) {
          return -1;
        }
      }
      else if (cVar1 == coda_backend_netcdf) {
        iVar2 = coda_netcdf_cursor_goto_attributes(cursor);
        if (iVar2 != 0) {
          return -1;
        }
      }
      else if ((cVar1 == coda_backend_grib) &&
              (iVar2 = coda_grib_cursor_goto_attributes(cursor), iVar2 != 0)) {
        return -1;
      }
    }
    if ((cursor->stack[cursor->n + -1].type)->backend == coda_backend_memory) {
      coda_mem_cursor_update_offset(cursor);
    }
    cursor_local._4_4_ = 0;
  }
  return cursor_local._4_4_;
}

Assistant:

LIBCODA_API int coda_cursor_goto_attributes(coda_cursor *cursor)
{
    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (cursor->n == CODA_CURSOR_MAXDEPTH)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "maximum depth in cursor (%d) reached (%s:%u)", cursor->n, __FILE__,
                       __LINE__);
        return -1;
    }

    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
        case coda_backend_binary:
            if (coda_ascbin_cursor_goto_attributes(cursor) != 0)
            {
                return -1;
            }
            break;
        case coda_backend_memory:
            if (coda_mem_cursor_goto_attributes(cursor) != 0)
            {
                return -1;
            }
            break;
        case coda_backend_hdf4:
#ifdef HAVE_HDF4
            if (coda_hdf4_cursor_goto_attributes(cursor) != 0)
            {
                return -1;
            }
            break;
#else
            coda_set_error(CODA_ERROR_NO_HDF4_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_hdf5:
#ifdef HAVE_HDF5
            if (coda_hdf5_cursor_goto_attributes(cursor) != 0)
            {
                return -1;
            }
            break;
#else
            coda_set_error(CODA_ERROR_NO_HDF5_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_cdf:
            if (coda_cdf_cursor_goto_attributes(cursor) != 0)
            {
                return -1;
            }
            break;
        case coda_backend_netcdf:
            if (coda_netcdf_cursor_goto_attributes(cursor) != 0)
            {
                return -1;
            }
            break;
        case coda_backend_grib:
            if (coda_grib_cursor_goto_attributes(cursor) != 0)
            {
                return -1;
            }
            break;
    }

    if (cursor->stack[cursor->n - 1].type->backend == coda_backend_memory)
    {
        coda_mem_cursor_update_offset(cursor);
    }

    return 0;
}